

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  undefined4 extraout_var;
  bool bVar6;
  char *local_560;
  ulong local_558;
  char *tok_buf;
  char *local_548;
  char *local_540;
  char value [256];
  char content [1024];
  
  local_540 = digest->nonce;
  local_560 = chlg;
  Curl_auth_digest_cleanup(digest);
  local_558 = 0;
  bVar6 = false;
  do {
    for (; (*chlg == ' ' || (*chlg == '\t')); chlg = chlg + 1) {
    }
    local_560 = chlg;
    _Var2 = Curl_auth_digest_get_pair(chlg,value,content,&local_560);
    if (!_Var2) {
      if ((local_540 == (char *)0x0) || ((digest->field_0x35 & 1) != 0)) {
        CVar4 = CURLE_BAD_CONTENT_ENCODING;
        if ((digest->nonce != (char *)0x0) &&
           ((digest->qop != (char *)0x0 || ((digest->algo & 1) == 0)))) {
          CVar4 = CURLE_OK;
        }
      }
      else {
        CVar4 = CURLE_BAD_CONTENT_ENCODING;
      }
      return CVar4;
    }
    iVar3 = Curl_strcasecompare(value,"nonce");
    if (iVar3 != 0) {
      (*Curl_cfree)(digest->nonce);
      pcVar5 = (*Curl_cstrdup)(content);
      digest->nonce = pcVar5;
      goto LAB_00424866;
    }
    iVar3 = Curl_strcasecompare(value,"stale");
    if (iVar3 != 0) {
      iVar3 = Curl_strcasecompare(content,"true");
      chlg = local_560;
      if (iVar3 != 0) {
        digest->field_0x35 = digest->field_0x35 | 1;
        digest->nc = 1;
      }
      goto LAB_00424874;
    }
    iVar3 = Curl_strcasecompare(value,"realm");
    if (iVar3 == 0) {
      iVar3 = Curl_strcasecompare(value,"opaque");
      if (iVar3 != 0) {
        (*Curl_cfree)(digest->opaque);
        pcVar5 = (*Curl_cstrdup)(content);
        digest->opaque = pcVar5;
        goto LAB_00424866;
      }
      iVar3 = Curl_strcasecompare(value,"qop");
      if (iVar3 != 0) {
        tok_buf = (char *)0x0;
        pcVar5 = (*Curl_cstrdup)(content);
        local_548 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        while (pcVar5 = strtok_r(pcVar5,",",&tok_buf), pcVar5 != (char *)0x0) {
          for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
          }
          iVar3 = Curl_strcasecompare(pcVar5,"auth");
          if (iVar3 == 0) {
            iVar3 = Curl_strcasecompare(pcVar5,"auth-int");
            bVar6 = (bool)(bVar6 | iVar3 != 0);
          }
          else {
            local_558 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
          }
          pcVar5 = (char *)0x0;
        }
        (*Curl_cfree)(local_548);
        if ((local_558 & 1) == 0) {
          chlg = local_560;
          if (!bVar6) goto LAB_00424874;
          (*Curl_cfree)(digest->qop);
          pcVar5 = "auth-int";
        }
        else {
          (*Curl_cfree)(digest->qop);
          pcVar5 = "auth";
        }
        pcVar5 = (*Curl_cstrdup)(pcVar5);
        digest->qop = pcVar5;
        goto LAB_00424866;
      }
      iVar3 = Curl_strcasecompare(value,"algorithm");
      if (iVar3 == 0) {
        iVar3 = Curl_strcasecompare(value,"userhash");
        chlg = local_560;
        if ((iVar3 != 0) &&
           (iVar3 = Curl_strcasecompare(content,"true"), chlg = local_560, iVar3 != 0)) {
          digest->field_0x35 = digest->field_0x35 | 2;
        }
      }
      else {
        (*Curl_cfree)(digest->algorithm);
        pcVar5 = (*Curl_cstrdup)(content);
        digest->algorithm = pcVar5;
        if (pcVar5 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar3 = Curl_strcasecompare(content,"MD5-sess");
        if (iVar3 == 0) {
          iVar3 = Curl_strcasecompare(content,"MD5");
          if (iVar3 == 0) {
            iVar3 = Curl_strcasecompare(content,"SHA-256");
            if (iVar3 == 0) {
              iVar3 = Curl_strcasecompare(content,"SHA-256-SESS");
              if (iVar3 == 0) {
                iVar3 = Curl_strcasecompare(content,"SHA-512-256");
                if (iVar3 == 0) {
                  iVar3 = Curl_strcasecompare(content,"SHA-512-256-SESS");
                  if (iVar3 == 0) {
                    return CURLE_BAD_CONTENT_ENCODING;
                  }
                  digest->algo = '\x05';
                  chlg = local_560;
                }
                else {
                  digest->algo = '\x04';
                  chlg = local_560;
                }
              }
              else {
                digest->algo = '\x03';
                chlg = local_560;
              }
            }
            else {
              digest->algo = '\x02';
              chlg = local_560;
            }
          }
          else {
            digest->algo = '\0';
            chlg = local_560;
          }
        }
        else {
          digest->algo = '\x01';
          chlg = local_560;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->realm);
      pcVar5 = (*Curl_cstrdup)(content);
      digest->realm = pcVar5;
LAB_00424866:
      chlg = local_560;
      if (pcVar5 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
LAB_00424874:
    for (; (cVar1 = *chlg, cVar1 == '\t' || (cVar1 == ' ')); chlg = chlg + 1) {
    }
    if (cVar1 == ',') {
      chlg = chlg + 1;
    }
  } while( true );
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISBLANK(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        char *tok_buf = NULL;
        /* Tokenize the list and choose auth if possible, use a temporary
           clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token) {
          /* Pass additional spaces here */
          while(*token && ISBLANK(*token))
            token++;
          if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = ALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = ALGO_MD5;
        else if(strcasecompare(content, "SHA-256"))
          digest->algo = ALGO_SHA256;
        else if(strcasecompare(content, "SHA-256-SESS"))
          digest->algo = ALGO_SHA256SESS;
        else if(strcasecompare(content, "SHA-512-256"))
          digest->algo = ALGO_SHA512_256;
        else if(strcasecompare(content, "SHA-512-256-SESS"))
          digest->algo = ALGO_SHA512_256SESS;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else if(strcasecompare(value, "userhash")) {
        if(strcasecompare(content, "true")) {
          digest->userhash = TRUE;
        }
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISBLANK(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  /* "<algo>-sess" protocol versions require "auth" or "auth-int" qop */
  if(!digest->qop && (digest->algo & SESSION_ALGO))
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}